

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

void __thiscall cmFileLockPool::ScopePool::~ScopePool(ScopePool *this)

{
  ScopePool *this_local;
  
  cmDeleteAll<std::__cxx11::list<cmFileLock*,std::allocator<cmFileLock*>>>(&this->Locks);
  std::__cxx11::list<cmFileLock_*,_std::allocator<cmFileLock_*>_>::~list(&this->Locks);
  return;
}

Assistant:

cmFileLockPool::ScopePool::~ScopePool()
{
  cmDeleteAll(this->Locks);
}